

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  FlowBuilder *this;
  shared_ptr<MyObserver> observer;
  Taskflow taskflow;
  Executor executor;
  string *in_stack_fffffffffffffb78;
  Taskflow *in_stack_fffffffffffffb80;
  Taskflow *this_00;
  Executor *this_01;
  future<void> *this_02;
  Taskflow *in_stack_fffffffffffffba0;
  shared_ptr<MyObserver> *ptr;
  allocator<char> *in_stack_fffffffffffffbb0;
  Executor *this_03;
  char *in_stack_fffffffffffffbb8;
  allocator<char> *__s;
  anon_class_1_0_00000001 *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_04;
  undefined8 in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  allocator<char> local_3e1;
  string local_3e0 [55];
  undefined1 local_3a9 [17];
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffc68;
  _Elt_pointer in_stack_fffffffffffffc70;
  Executor *in_stack_fffffffffffffc78;
  allocator<char> local_371;
  string local_370 [55];
  allocator<char> local_339;
  string local_338 [55];
  undefined1 local_301 [56];
  undefined1 local_2c9 [56];
  allocator<char> local_291;
  string local_290 [55];
  undefined1 local_259 [597];
  int local_4;
  
  local_4 = 0;
  uVar1 = std::thread::hardware_concurrency();
  this = (FlowBuilder *)(ulong)uVar1;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x10588a);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffba0);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_observer_cpp:40:20),_nullptr>
            (this,in_stack_fffffffffffffbc0);
  this_04 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_259;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_04,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  tf::Task::name((Task *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string((string *)(local_259 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_259);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_observer_cpp:41:20),_nullptr>
            (this,(anon_class_1_0_00000001 *)this_04);
  __s = &local_291;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_04,(char *)__s,in_stack_fffffffffffffbb0);
  tf::Task::name((Task *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_observer_cpp:42:20),_nullptr>
            (this,(anon_class_1_0_00000001 *)this_04);
  this_03 = (Executor *)local_2c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_04,(char *)__s,(allocator<char> *)this_03)
  ;
  tf::Task::name((Task *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string((string *)(local_2c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2c9);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_observer_cpp:43:20),_nullptr>
            (this,(anon_class_1_0_00000001 *)this_04);
  ptr = (shared_ptr<MyObserver> *)local_301;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_04,(char *)__s,(allocator<char> *)this_03)
  ;
  tf::Task::name((Task *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string((string *)(local_301 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_301);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_observer_cpp:44:20),_nullptr>
            (this,(anon_class_1_0_00000001 *)this_04);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_04,(char *)__s,(allocator<char> *)this_03)
  ;
  tf::Task::name((Task *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_observer_cpp:45:20),_nullptr>
            (this,(anon_class_1_0_00000001 *)this_04);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_04,(char *)__s,(allocator<char> *)this_03)
  ;
  tf::Task::name((Task *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_observer_cpp:46:20),_nullptr>
            (this,(anon_class_1_0_00000001 *)this_04);
  this_02 = (future<void> *)local_3a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_04,(char *)__s,(allocator<char> *)this_03)
  ;
  tf::Task::name((Task *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string((string *)(local_3a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3a9);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_observer_cpp:47:20),_nullptr>
            (this,(anon_class_1_0_00000001 *)this_04);
  this_01 = (Executor *)&local_3e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_04,(char *)__s,(allocator<char> *)this_03)
  ;
  tf::Task::name((Task *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  tf::Executor::make_observer<MyObserver,char_const(&)[11]>
            ((Executor *)in_stack_fffffffffffffbf8,(char (*) [11])in_stack_fffffffffffffbf0);
  tf::Executor::run(this_01,in_stack_fffffffffffffb80);
  std::future<void>::get(this_02);
  tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffb80);
  this_00 = (Taskflow *)&stack0xfffffffffffffbd8;
  std::shared_ptr<MyObserver>::shared_ptr
            ((shared_ptr<MyObserver> *)this_00,(shared_ptr<MyObserver> *)in_stack_fffffffffffffb78);
  tf::Executor::remove_observer<MyObserver>(this_03,ptr);
  std::shared_ptr<MyObserver>::~shared_ptr((shared_ptr<MyObserver> *)0x105d06);
  local_4 = 0;
  std::shared_ptr<MyObserver>::~shared_ptr((shared_ptr<MyObserver> *)0x105d1e);
  tf::Taskflow::~Taskflow(this_00);
  tf::Executor::~Executor(this_03);
  return local_4;
}

Assistant:

int main(){

  tf::Executor executor;

  // Create a taskflow of eight tasks
  tf::Taskflow taskflow;

  taskflow.emplace([] () { std::cout << "1\n"; }).name("A");
  taskflow.emplace([] () { std::cout << "2\n"; }).name("B");
  taskflow.emplace([] () { std::cout << "3\n"; }).name("C");
  taskflow.emplace([] () { std::cout << "4\n"; }).name("D");
  taskflow.emplace([] () { std::cout << "5\n"; }).name("E");
  taskflow.emplace([] () { std::cout << "6\n"; }).name("F");
  taskflow.emplace([] () { std::cout << "7\n"; }).name("G");
  taskflow.emplace([] () { std::cout << "8\n"; }).name("H");

  // create a default observer
  std::shared_ptr<MyObserver> observer = executor.make_observer<MyObserver>("MyObserver");

  // run the taskflow
  executor.run(taskflow).get();

  // remove the observer (optional)
  executor.remove_observer(std::move(observer));

  return 0;
}